

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::string_t,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::VectorTryCastStringOperator<duckdb::TryCastToBit>>
               (string_t *ldata,string_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  ulong idx;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  idx_t i;
  idx_t idx_00;
  ulong idx_01;
  ulong uVar6;
  ulong uVar7;
  string_t input;
  string_t input_00;
  string_t sVar8;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    lVar3 = 8;
    for (idx_00 = 0; count != idx_00; idx_00 = idx_00 + 1) {
      sVar8.value.pointer.ptr = (char *)*(undefined8 *)((long)&ldata->value + lVar3);
      sVar8.value._0_8_ = *(undefined8 *)((long)ldata + lVar3 + -8);
      sVar8 = VectorTryCastStringOperator<duckdb::TryCastToBit>::
              Operation<duckdb::string_t,duckdb::string_t>(sVar8,result_mask,idx_00,dataptr);
      *(long *)((long)result_data + lVar3 + -8) = sVar8.value._0_8_;
      *(long *)((long)&result_data->value + lVar3) = sVar8.value._8_8_;
      lVar3 = lVar3 + 0x10;
    }
  }
  else {
    if (adds_nulls) {
      TemplatedValidityMask<unsigned_long>::Copy
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>,count);
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>);
    }
    idx_01 = 0;
    for (uVar2 = 0; uVar2 != count + 0x3f >> 6; uVar2 = uVar2 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar7 = idx_01 + 0x40;
        if (count <= idx_01 + 0x40) {
          uVar7 = count;
        }
LAB_0177a782:
        uVar4 = idx_01 << 4 | 8;
        for (; idx = idx_01, idx_01 < uVar7; idx_01 = idx_01 + 1) {
          input.value.pointer.ptr = (char *)*(undefined8 *)((long)&ldata->value + uVar4);
          input.value._0_8_ = *(undefined8 *)((long)ldata + (uVar4 - 8));
          sVar8 = VectorTryCastStringOperator<duckdb::TryCastToBit>::
                  Operation<duckdb::string_t,duckdb::string_t>(input,result_mask,idx_01,dataptr);
          *(long *)((long)result_data + (uVar4 - 8)) = sVar8.value._0_8_;
          *(long *)((long)&result_data->value + uVar4) = sVar8.value._8_8_;
          uVar4 = uVar4 + 0x10;
        }
      }
      else {
        uVar4 = puVar1[uVar2];
        uVar7 = idx_01 + 0x40;
        if (count <= idx_01 + 0x40) {
          uVar7 = count;
        }
        if (uVar4 == 0xffffffffffffffff) goto LAB_0177a782;
        idx = uVar7;
        if (uVar4 != 0) {
          uVar5 = idx_01 << 4 | 8;
          for (uVar6 = 0; idx = uVar6 + idx_01, idx < uVar7; uVar6 = uVar6 + 1) {
            if ((uVar4 >> (uVar6 & 0x3f) & 1) != 0) {
              input_00.value.pointer.ptr = (char *)*(undefined8 *)((long)&ldata->value + uVar5);
              input_00.value._0_8_ = *(undefined8 *)((long)ldata + (uVar5 - 8));
              sVar8 = VectorTryCastStringOperator<duckdb::TryCastToBit>::
                      Operation<duckdb::string_t,duckdb::string_t>(input_00,result_mask,idx,dataptr)
              ;
              *(long *)((long)result_data + (uVar5 - 8)) = sVar8.value._0_8_;
              *(long *)((long)&result_data->value + uVar5) = sVar8.value._8_8_;
            }
            uVar5 = uVar5 + 0x10;
          }
        }
      }
      idx_01 = idx;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}